

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::ExpandVariablesCMP0019(cmMakefile *this)

{
  cmTarget *pcVar1;
  bool bVar2;
  byte bVar3;
  PolicyStatus PVar4;
  TargetType TVar5;
  char *pcVar6;
  string *psVar7;
  reference pbVar8;
  ostream *poVar9;
  cmake *this_00;
  PolicyID id;
  string local_5f8;
  string local_5d8 [32];
  string local_5b8;
  undefined1 local_598 [8];
  ostringstream m;
  string local_420 [32];
  undefined1 local_400 [8];
  string orig_1;
  string libName;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3b8;
  iterator l;
  string local_3a8;
  undefined1 local_388 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkLibs;
  string local_368;
  char *local_348;
  char *linkLibsProp;
  undefined1 local_338 [8];
  string orig;
  undefined1 local_310 [8];
  string d;
  string local_2e8;
  char *local_2c8;
  char *linkDirsProp;
  string local_2b8;
  allocator<char> local_291;
  undefined1 local_290 [8];
  string dirs_1;
  string local_268;
  cmTarget *local_248;
  cmTarget *t;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>
  *target;
  iterator __end1;
  iterator __begin1;
  cmTargetMap *__range1;
  string local_218;
  allocator<char> local_1f1;
  undefined1 local_1f0 [8];
  string dirs;
  allocator<char> local_1b9;
  string local_1b8;
  char *local_198;
  char *includeDirs;
  ostringstream w;
  PolicyStatus pol;
  cmMakefile *this_local;
  
  PVar4 = GetPolicyStatus(this,CMP0019,false);
  if ((PVar4 == OLD) || (PVar4 == WARN)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&includeDirs);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b8,"INCLUDE_DIRECTORIES",&local_1b9);
    pcVar6 = GetProperty(this,&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::allocator<char>::~allocator(&local_1b9);
    local_198 = pcVar6;
    bVar2 = mightExpandVariablesCMP0019(pcVar6);
    pcVar6 = local_198;
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_1f0,pcVar6,&local_1f1);
      std::allocator<char>::~allocator(&local_1f1);
      ExpandVariablesInString(this,(string *)local_1f0,true,true,false,(char *)0x0,-1,false,false);
      if ((PVar4 == WARN) &&
         (bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_1f0,local_198), bVar2)) {
        poVar9 = std::operator<<((ostream *)&includeDirs,"Evaluated directory INCLUDE_DIRECTORIES\n"
                                );
        poVar9 = std::operator<<(poVar9,"  ");
        poVar9 = std::operator<<(poVar9,local_198);
        poVar9 = std::operator<<(poVar9,"\n");
        poVar9 = std::operator<<(poVar9,"as\n");
        poVar9 = std::operator<<(poVar9,"  ");
        poVar9 = std::operator<<(poVar9,(string *)local_1f0);
        std::operator<<(poVar9,"\n");
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_218,"INCLUDE_DIRECTORIES",(allocator<char> *)((long)&__range1 + 7)
                );
      pcVar6 = (char *)std::__cxx11::string::c_str();
      SetProperty(this,&local_218,pcVar6);
      std::__cxx11::string::~string((string *)&local_218);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
      std::__cxx11::string::~string((string *)local_1f0);
    }
    __end1 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
             ::begin(&this->Targets);
    target = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>
              *)std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
                ::end(&this->Targets);
    while (bVar2 = std::__detail::operator!=
                             (&__end1.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                              ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                                *)&target), bVar2) {
      t = (cmTarget *)
          std::__detail::
          _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
          ::operator*(&__end1);
      local_248 = &((reference)t)->second;
      TVar5 = cmTarget::GetType(local_248);
      if ((TVar5 != INTERFACE_LIBRARY) &&
         (TVar5 = cmTarget::GetType(local_248), pcVar1 = local_248, TVar5 != GLOBAL_TARGET)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_268,"INCLUDE_DIRECTORIES",
                   (allocator<char> *)(dirs_1.field_2._M_local_buf + 0xf));
        local_198 = cmTarget::GetProperty(pcVar1,&local_268);
        std::__cxx11::string::~string((string *)&local_268);
        std::allocator<char>::~allocator((allocator<char> *)(dirs_1.field_2._M_local_buf + 0xf));
        bVar2 = mightExpandVariablesCMP0019(local_198);
        pcVar6 = local_198;
        if (bVar2) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)local_290,pcVar6,&local_291);
          std::allocator<char>::~allocator(&local_291);
          ExpandVariablesInString
                    (this,(string *)local_290,true,true,false,(char *)0x0,-1,false,false);
          if ((PVar4 == WARN) &&
             (bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_290,local_198), bVar2)) {
            poVar9 = std::operator<<((ostream *)&includeDirs,"Evaluated target ");
            psVar7 = cmTarget::GetName_abi_cxx11_(local_248);
            poVar9 = std::operator<<(poVar9,(string *)psVar7);
            poVar9 = std::operator<<(poVar9," INCLUDE_DIRECTORIES\n");
            poVar9 = std::operator<<(poVar9,"  ");
            poVar9 = std::operator<<(poVar9,local_198);
            poVar9 = std::operator<<(poVar9,"\n");
            poVar9 = std::operator<<(poVar9,"as\n");
            poVar9 = std::operator<<(poVar9,"  ");
            poVar9 = std::operator<<(poVar9,(string *)local_290);
            std::operator<<(poVar9,"\n");
          }
          pcVar1 = local_248;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2b8,"INCLUDE_DIRECTORIES",
                     (allocator<char> *)((long)&linkDirsProp + 7));
          pcVar6 = (char *)std::__cxx11::string::c_str();
          cmTarget::SetProperty(pcVar1,&local_2b8,pcVar6);
          std::__cxx11::string::~string((string *)&local_2b8);
          std::allocator<char>::~allocator((allocator<char> *)((long)&linkDirsProp + 7));
          std::__cxx11::string::~string((string *)local_290);
        }
      }
      std::__detail::
      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
      ::operator++(&__end1);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e8,"LINK_DIRECTORIES",
               (allocator<char> *)(d.field_2._M_local_buf + 0xf));
    pcVar6 = GetProperty(this,&local_2e8);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::allocator<char>::~allocator((allocator<char> *)(d.field_2._M_local_buf + 0xf));
    local_2c8 = pcVar6;
    if ((pcVar6 != (char *)0x0) &&
       (bVar2 = mightExpandVariablesCMP0019(pcVar6), pcVar6 = local_2c8, bVar2)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_310,pcVar6,(allocator<char> *)(orig.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(orig.field_2._M_local_buf + 0xf));
      pcVar6 = local_2c8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_338,pcVar6,(allocator<char> *)((long)&linkLibsProp + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&linkLibsProp + 7));
      ExpandVariablesInString(this,(string *)local_310,true,true,false,(char *)0x0,-1,false,false);
      if ((PVar4 == WARN) &&
         (bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_310,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_338), bVar2)) {
        poVar9 = std::operator<<((ostream *)&includeDirs,"Evaluated link directories\n");
        poVar9 = std::operator<<(poVar9,"  ");
        poVar9 = std::operator<<(poVar9,(string *)local_338);
        poVar9 = std::operator<<(poVar9,"\n");
        poVar9 = std::operator<<(poVar9,"as\n");
        poVar9 = std::operator<<(poVar9,"  ");
        poVar9 = std::operator<<(poVar9,(string *)local_310);
        std::operator<<(poVar9,"\n");
      }
      std::__cxx11::string::~string((string *)local_338);
      std::__cxx11::string::~string((string *)local_310);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_368,"LINK_LIBRARIES",
               (allocator<char> *)
               ((long)&linkLibs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    pcVar6 = GetProperty(this,&local_368);
    std::__cxx11::string::~string((string *)&local_368);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&linkLibs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    local_348 = pcVar6;
    if (pcVar6 != (char *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_388);
      pcVar6 = local_348;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3a8,pcVar6,(allocator<char> *)((long)&l._M_current + 7));
      cmSystemTools::ExpandListArgument
                (&local_3a8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_388,false);
      std::__cxx11::string::~string((string *)&local_3a8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&l._M_current + 7));
      local_3b8._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_388);
      while( true ) {
        libName.field_2._8_8_ =
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_388);
        bVar2 = __gnu_cxx::operator!=
                          (&local_3b8,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)((long)&libName.field_2 + 8));
        if (!bVar2) break;
        pbVar8 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_3b8);
        std::__cxx11::string::string((string *)(orig_1.field_2._M_local_buf + 8),(string *)pbVar8);
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&orig_1.field_2 + 8),"optimized");
        if (bVar2) {
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_3b8);
          pbVar8 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_3b8);
          std::__cxx11::string::operator=
                    ((string *)(orig_1.field_2._M_local_buf + 8),(string *)pbVar8);
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&orig_1.field_2 + 8),"debug");
          if (bVar2) {
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&local_3b8);
            pbVar8 = __gnu_cxx::
                     __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&local_3b8);
            std::__cxx11::string::operator=
                      ((string *)(orig_1.field_2._M_local_buf + 8),(string *)pbVar8);
          }
        }
        pcVar6 = (char *)std::__cxx11::string::c_str();
        bVar2 = mightExpandVariablesCMP0019(pcVar6);
        if (bVar2) {
          std::__cxx11::string::string
                    ((string *)local_400,(string *)(orig_1.field_2._M_local_buf + 8));
          ExpandVariablesInString
                    (this,(string *)((long)&orig_1.field_2 + 8),true,true,false,(char *)0x0,-1,false
                     ,false);
          if ((PVar4 == WARN) &&
             (bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)&orig_1.field_2 + 8),
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_400), bVar2)) {
            poVar9 = std::operator<<((ostream *)&includeDirs,"Evaluated link library\n");
            poVar9 = std::operator<<(poVar9,"  ");
            poVar9 = std::operator<<(poVar9,(string *)local_400);
            poVar9 = std::operator<<(poVar9,"\n");
            poVar9 = std::operator<<(poVar9,"as\n");
            poVar9 = std::operator<<(poVar9,"  ");
            poVar9 = std::operator<<(poVar9,(string *)(orig_1.field_2._M_local_buf + 8));
            std::operator<<(poVar9,"\n");
          }
          std::__cxx11::string::~string((string *)local_400);
        }
        std::__cxx11::string::~string((string *)(orig_1.field_2._M_local_buf + 8));
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_3b8);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_388);
    }
    std::__cxx11::ostringstream::str();
    bVar3 = std::__cxx11::string::empty();
    std::__cxx11::string::~string(local_420);
    if (((bVar3 ^ 0xff) & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_598);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_5b8,(cmPolicies *)0x13,id);
      poVar9 = std::operator<<((ostream *)local_598,(string *)&local_5b8);
      poVar9 = std::operator<<(poVar9,"\n");
      poVar9 = std::operator<<(poVar9,"The following variable evaluations were encountered:\n");
      std::__cxx11::ostringstream::str();
      std::operator<<(poVar9,local_5d8);
      std::__cxx11::string::~string(local_5d8);
      std::__cxx11::string::~string((string *)&local_5b8);
      this_00 = GetCMakeInstance(this);
      std::__cxx11::ostringstream::str();
      cmake::IssueMessage(this_00,AUTHOR_WARNING,&local_5f8,&this->Backtrace);
      std::__cxx11::string::~string((string *)&local_5f8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_598);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&includeDirs);
  }
  return;
}

Assistant:

void cmMakefile::ExpandVariablesCMP0019()
{
  // Drop this ancient compatibility behavior with a policy.
  cmPolicies::PolicyStatus pol = this->GetPolicyStatus(cmPolicies::CMP0019);
  if (pol != cmPolicies::OLD && pol != cmPolicies::WARN) {
    return;
  }
  std::ostringstream w;

  const char* includeDirs = this->GetProperty("INCLUDE_DIRECTORIES");
  if (mightExpandVariablesCMP0019(includeDirs)) {
    std::string dirs = includeDirs;
    this->ExpandVariablesInString(dirs, true, true);
    if (pol == cmPolicies::WARN && dirs != includeDirs) {
      /* clang-format off */
      w << "Evaluated directory INCLUDE_DIRECTORIES\n"
        << "  " << includeDirs << "\n"
        << "as\n"
        << "  " << dirs << "\n";
      /* clang-format on */
    }
    this->SetProperty("INCLUDE_DIRECTORIES", dirs.c_str());
  }

  // Also for each target's INCLUDE_DIRECTORIES property:
  for (auto& target : this->Targets) {
    cmTarget& t = target.second;
    if (t.GetType() == cmStateEnums::INTERFACE_LIBRARY ||
        t.GetType() == cmStateEnums::GLOBAL_TARGET) {
      continue;
    }
    includeDirs = t.GetProperty("INCLUDE_DIRECTORIES");
    if (mightExpandVariablesCMP0019(includeDirs)) {
      std::string dirs = includeDirs;
      this->ExpandVariablesInString(dirs, true, true);
      if (pol == cmPolicies::WARN && dirs != includeDirs) {
        /* clang-format off */
        w << "Evaluated target " << t.GetName() << " INCLUDE_DIRECTORIES\n"
          << "  " << includeDirs << "\n"
          << "as\n"
          << "  " << dirs << "\n";
        /* clang-format on */
      }
      t.SetProperty("INCLUDE_DIRECTORIES", dirs.c_str());
    }
  }

  if (const char* linkDirsProp = this->GetProperty("LINK_DIRECTORIES")) {
    if (mightExpandVariablesCMP0019(linkDirsProp)) {
      std::string d = linkDirsProp;
      std::string orig = linkDirsProp;
      this->ExpandVariablesInString(d, true, true);
      if (pol == cmPolicies::WARN && d != orig) {
        /* clang-format off */
        w << "Evaluated link directories\n"
          << "  " << orig << "\n"
          << "as\n"
          << "  " << d << "\n";
        /* clang-format on */
      }
    }
  }

  if (const char* linkLibsProp = this->GetProperty("LINK_LIBRARIES")) {
    std::vector<std::string> linkLibs;
    cmSystemTools::ExpandListArgument(linkLibsProp, linkLibs);

    for (std::vector<std::string>::iterator l = linkLibs.begin();
         l != linkLibs.end(); ++l) {
      std::string libName = *l;
      if (libName == "optimized") {
        ++l;
        libName = *l;
      } else if (libName == "debug") {
        ++l;
        libName = *l;
      }
      if (mightExpandVariablesCMP0019(libName.c_str())) {
        std::string orig = libName;
        this->ExpandVariablesInString(libName, true, true);
        if (pol == cmPolicies::WARN && libName != orig) {
          /* clang-format off */
        w << "Evaluated link library\n"
          << "  " << orig << "\n"
          << "as\n"
          << "  " << libName << "\n";
          /* clang-format on */
        }
      }
    }
  }

  if (!w.str().empty()) {
    std::ostringstream m;
    /* clang-format off */
    m << cmPolicies::GetPolicyWarning(cmPolicies::CMP0019)
      << "\n"
      << "The following variable evaluations were encountered:\n"
      << w.str();
    /* clang-format on */
    this->GetCMakeInstance()->IssueMessage(MessageType::AUTHOR_WARNING,
                                           m.str(), this->Backtrace);
  }
}